

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack7_32(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  uVar1 = *(ulong *)(in + 1);
  uVar6 = (uint)uVar1;
  auVar7._4_4_ = uVar6;
  auVar7._0_4_ = uVar6;
  auVar7._8_4_ = uVar6;
  auVar7._12_4_ = uVar6;
  auVar11 = vpinsrd_avx(auVar7,*in,0);
  auVar7 = vpbroadcastd_avx512vl();
  auVar5 = vpsrlvd_avx2(auVar7,_DAT_001a5e70);
  auVar7 = vpinsrd_avx(auVar7,*in >> 7,1);
  auVar7 = vpunpcklqdq_avx(auVar7,auVar5);
  auVar10._8_4_ = 0x7f;
  auVar10._0_8_ = 0x7f0000007f;
  auVar10._12_4_ = 0x7f;
  auVar7 = vpand_avx(auVar7,auVar10);
  *(undefined1 (*) [16])out = auVar7;
  auVar7 = vpshufd_avx(auVar11,0x54);
  auVar5 = vpsrlvd_avx2(auVar7,_DAT_001a5e80);
  auVar7 = vpinsrd_avx(auVar10,(uVar6 & 7) << 4,0);
  auVar11 = vpor_avx(auVar5,auVar7);
  auVar7 = vpand_avx(auVar5,auVar10);
  auVar7 = vpblendd_avx2(auVar7,auVar11,1);
  *(undefined1 (*) [16])(out + 4) = auVar7;
  uVar2 = *(ulong *)(in + 3);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar2;
  auVar5 = vpshufd_avx(auVar12,0x54);
  auVar7 = vpmovsxbq_avx(ZEXT216(5));
  uVar3 = *(ulong *)(in + 5);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar3;
  auVar4 = vpshufd_avx(auVar8,0x54);
  auVar8 = vpermt2d_avx512vl(auVar8,auVar7,auVar12);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar1;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar2;
  auVar9 = vpermt2d_avx512vl(auVar9,auVar7,auVar11);
  auVar7 = vpinsrd_avx(auVar10,(int)(uVar1 >> 0x20) * 2 & 0x7e,0);
  auVar11 = vpshufd_avx(auVar11,0x54);
  auVar12 = vpsrlvd_avx2(auVar11,_DAT_001a5e90);
  auVar11 = vpor_avx(auVar12,auVar7);
  auVar7 = vpand_avx(auVar12,auVar10);
  auVar7 = vpblendd_avx2(auVar7,auVar11,1);
  out[8] = uVar6 >> 0x18 & 0x7f;
  *(undefined1 (*) [16])(out + 9) = auVar7;
  auVar12 = vpsrlvd_avx2(auVar9,_DAT_001a5ea0);
  auVar7 = vpinsrd_avx(auVar10,((uint)uVar2 & 3) << 5,0);
  auVar11 = vpor_avx(auVar12,auVar7);
  auVar7 = vpand_avx(auVar12,auVar10);
  auVar7 = vpblendd_avx2(auVar7,auVar11,1);
  *(undefined1 (*) [16])(out + 0xd) = auVar7;
  out[0x11] = (uint)uVar2 >> 0x17 & 0x7f;
  auVar5 = vpsrlvd_avx2(auVar5,_DAT_001a5eb0);
  auVar7 = vpinsrd_avx(auVar10,((uint)(uVar2 >> 0x20) & 0x1f) << 2,0);
  auVar11 = vpor_avx(auVar5,auVar7);
  auVar7 = vpand_avx(auVar5,auVar10);
  auVar7 = vpblendd_avx2(auVar7,auVar11,1);
  *(undefined1 (*) [16])(out + 0x12) = auVar7;
  auVar5 = vpsrlvd_avx2(auVar8,_DAT_001a5ec0);
  auVar7 = vpinsrd_avx(auVar10,((uint)uVar3 & 1) << 6,0);
  auVar11 = vpor_avx(auVar5,auVar7);
  auVar7 = vpand_avx(auVar5,auVar10);
  auVar7 = vpblendd_avx2(auVar7,auVar11,1);
  *(undefined1 (*) [16])(out + 0x16) = auVar7;
  out[0x1a] = (uint)uVar3 >> 0x16 & 0x7f;
  auVar5 = vpsrlvd_avx2(auVar4,_DAT_001a5ed0);
  uVar6 = (uint)(uVar3 >> 0x20);
  auVar7 = vpinsrd_avx(auVar10,(uVar6 & 0xf) << 3,0);
  auVar11 = vpor_avx(auVar5,auVar7);
  auVar7 = vpand_avx(auVar5,auVar10);
  auVar7 = vpblendd_avx2(auVar7,auVar11,1);
  *(undefined1 (*) [16])(out + 0x1b) = auVar7;
  out[0x1f] = uVar6 >> 0x19;
  return in + 7;
}

Assistant:

const uint32_t *__fastunpack7_32(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 7);
  out++;
  *out = ((*in) >> 7) % (1U << 7);
  out++;
  *out = ((*in) >> 14) % (1U << 7);
  out++;
  *out = ((*in) >> 21) % (1U << 7);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 3)) << (7 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 7);
  out++;
  *out = ((*in) >> 10) % (1U << 7);
  out++;
  *out = ((*in) >> 17) % (1U << 7);
  out++;
  *out = ((*in) >> 24) % (1U << 7);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 6)) << (7 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 7);
  out++;
  *out = ((*in) >> 13) % (1U << 7);
  out++;
  *out = ((*in) >> 20) % (1U << 7);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 2)) << (7 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 7);
  out++;
  *out = ((*in) >> 9) % (1U << 7);
  out++;
  *out = ((*in) >> 16) % (1U << 7);
  out++;
  *out = ((*in) >> 23) % (1U << 7);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 5)) << (7 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 7);
  out++;
  *out = ((*in) >> 12) % (1U << 7);
  out++;
  *out = ((*in) >> 19) % (1U << 7);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 1)) << (7 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 7);
  out++;
  *out = ((*in) >> 8) % (1U << 7);
  out++;
  *out = ((*in) >> 15) % (1U << 7);
  out++;
  *out = ((*in) >> 22) % (1U << 7);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 4)) << (7 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 7);
  out++;
  *out = ((*in) >> 11) % (1U << 7);
  out++;
  *out = ((*in) >> 18) % (1U << 7);
  out++;
  *out = ((*in) >> 25);
  ++in;
  out++;

  return in;
}